

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_> *
__thiscall
llvm::DWARFUnit::findRnglistFromIndex
          (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
           *__return_storage_ptr__,DWARFUnit *this,uint32_t Index)

{
  bool bVar1;
  char *Msg;
  long lVar2;
  error_code EC;
  error_code EC_00;
  Error local_30;
  Error local_28;
  uint32_t local_1c;
  uint32_t Index_local;
  
  if ((this->RngListTable).Storage.hasVal == true) {
    lVar2 = (long)(this->RngListTable).Storage.field_0.value.
                  super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((ulong)Index <
        (ulong)((long)*(pointer *)
                       ((long)&(this->RngListTable).Storage.field_0.value.
                               super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8
                       ) - lVar2 >> 3)) {
      lVar2 = *(long *)(lVar2 + (ulong)Index * 8);
      bVar1 = true;
      goto LAB_00d91254;
    }
  }
  bVar1 = false;
  lVar2 = 0;
LAB_00d91254:
  local_1c = Index;
  if (bVar1) {
    findRnglistFromOffset(__return_storage_ptr__,this,lVar2 + this->RangeSectionBase);
  }
  else {
    bVar1 = (this->RngListTable).Storage.hasVal;
    Msg = (char *)std::_V2::generic_category();
    if (bVar1 == true) {
      EC._M_cat = (error_category *)0x16;
      EC._0_8_ = &local_30;
      createStringError<unsigned_int>(EC,Msg,(uint *)"invalid range list table index %d");
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected(__return_storage_ptr__,&local_30);
    }
    else {
      EC_00._M_cat = (error_category *)0x16;
      EC_00._0_8_ = &local_28;
      createStringError(EC_00,Msg);
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected(__return_storage_ptr__,&local_28);
      local_30.Payload = local_28.Payload;
    }
    if ((long *)((ulong)local_30.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_30.Payload & 0xfffffffffffffffe) + 8))();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFAddressRangesVector>
DWARFUnit::findRnglistFromIndex(uint32_t Index) {
  if (auto Offset = getRnglistOffset(Index))
    return findRnglistFromOffset(*Offset + RangeSectionBase);

  if (RngListTable)
    return createStringError(errc::invalid_argument,
                             "invalid range list table index %d", Index);

  return createStringError(errc::invalid_argument,
                           "missing or invalid range list table");
}